

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

int __thiscall rcg::Interface::open(Interface *this,char *__file,int __oflag,...)

{
  PTLUpdateInterfaceList p_Var1;
  PTLOpenInterface p_Var2;
  GC_ERROR GVar3;
  int iVar4;
  void *pvVar5;
  GenTLException *this_00;
  int __oflag_00;
  char *pcVar6;
  allocator local_41;
  string local_40;
  
  std::mutex::lock(&this->mtx);
  iVar4 = this->n_open;
  if (iVar4 == 0) {
    System::open((this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __file,__oflag_00);
    p_Var1 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->TLUpdateInterfaceList;
    pvVar5 = System::getHandle((this->parent).
                               super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (*p_Var1)(pvVar5,(bool8_t *)0x0,10);
    p_Var2 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->TLOpenInterface;
    pvVar5 = System::getHandle((this->parent).
                               super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pcVar6 = (this->id)._M_dataplus._M_p;
    GVar3 = (*p_Var2)(pvVar5,pcVar6,&this->ifh);
    if (GVar3 != 0) {
      System::close((this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(int)pcVar6);
      this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"Interface::open()",&local_41);
      GenTLException::GenTLException(this_00,&local_40,&this->gentl);
      __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    iVar4 = this->n_open;
  }
  this->n_open = iVar4 + 1;
  iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar4;
}

Assistant:

void Interface::open()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // updating before opening is apparently necessary for some TLs

    gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10);

    if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Interface::open()", gentl);
    }
  }

  n_open++;
}